

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLIListener.cpp
# Opt level: O3

void __thiscall CLIListener::do_fetch(CLIListener *this,Poll *p,string *arg)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  pointer pcVar1;
  uint64_t uVar2;
  MultiQuery<dto::Simple,_dto::Complex> *this_01;
  code *pcVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  long lVar7;
  char *pcVar8;
  shared_ptr<MultiQuery<dto::Simple,_dto::Complex>_> query;
  mapped_type addr;
  Simple dto;
  MultiQuery<dto::Simple,_dto::Complex> *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  shared_ptr<Subscriber> local_128;
  long *local_118;
  long local_110;
  long local_108 [2];
  code *local_f8;
  undefined8 uStack_f0;
  unsigned_short local_e8;
  undefined6 uStack_e6;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0;
  undefined7 uStack_cf;
  undefined8 uStack_c8;
  Poll *local_c0;
  CLIListener *local_b8;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  undefined1 local_88 [24];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  OnError local_50;
  
  this_00 = &this->file_server;
  iVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_00->_M_h,arg);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pcVar8 = "Could not find a server to fetch from, execute search first";
    lVar7 = 0x3b;
    poVar6 = (ostream *)&std::cout;
  }
  else {
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this_00->_M_h,arg);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this_00,arg);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      pcVar1 = (pmVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,pcVar1,pcVar1 + pmVar5->_M_string_length);
      uVar2 = this->cmd_seq;
      this->cmd_seq = uVar2 + 1;
      local_118 = local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"GET","");
      local_f8 = (code *)&local_e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_118,local_110 + (long)local_118);
      local_70._M_p = (pointer)&local_60;
      local_88._16_2_ = 0;
      local_68 = 0;
      local_60._M_local_buf[0] = '\0';
      local_88[0] = '\0';
      local_88[1] = '\0';
      local_88[2] = '\0';
      local_88[3] = '\0';
      local_88[4] = '\0';
      local_88[5] = '\0';
      local_88[6] = '\0';
      local_88[7] = '\0';
      local_88._10_6_ = 0;
      local_88[8] = '\0';
      local_88[9] = '\0';
      std::__cxx11::string::operator=((string *)&local_70,(string *)arg);
      pcVar3 = local_f8;
      strcpy(local_88,(char *)local_f8);
      local_88._10_6_ = (undefined6)uVar2;
      local_88._16_2_ = (undefined2)(uVar2 >> 0x30);
      if (pcVar3 != (code *)&local_e8) {
        operator_delete(pcVar3,CONCAT62(uStack_e6,local_e8) + 1);
      }
      if (local_118 != local_108) {
        operator_delete(local_118,local_108[0] + 1);
      }
      local_158 = (MultiQuery<dto::Simple,_dto::Complex> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<MultiQuery<dto::Simple,dto::Complex>,std::allocator<MultiQuery<dto::Simple,dto::Complex>>,dto::Simple&,unsigned_short&,std::__cxx11::string&,int_const&>
                (&local_150,&local_158,
                 (allocator<MultiQuery<dto::Simple,_dto::Complex>_> *)&local_f8,(Simple *)local_88,
                 &this->port,&local_148,&LONG_TIMEOUT_MILLIS);
      local_128.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           &local_158->super_Subscriber;
      local_128.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_150._M_pi;
      if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_150._M_pi)->_M_use_count = (local_150._M_pi)->_M_use_count + 1;
        }
      }
      Poll::subscribe(p,&local_128);
      if (local_128.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.super___shared_ptr<Subscriber,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      this_01 = local_158;
      local_f8 = on_fetch_result;
      uStack_f0 = 0;
      local_e8 = this->port;
      local_e0 = &local_d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,local_148._M_dataplus._M_p,
                 local_148._M_dataplus._M_p + local_148._M_string_length);
      local_a8._M_unused._M_object = (void *)0x0;
      local_a8._8_8_ = 0;
      local_98 = (code *)0x0;
      pcStack_90 = (code *)0x0;
      local_c0 = p;
      local_b8 = this;
      local_a8._M_unused._M_object = operator_new(0x48);
      *(code **)local_a8._M_unused._0_8_ = local_f8;
      *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = uStack_f0;
      *(unsigned_short *)((long)local_a8._M_unused._0_8_ + 0x10) = local_e8;
      *(code **)((long)local_a8._M_unused._0_8_ + 0x18) =
           (code *)((long)local_a8._M_unused._0_8_ + 0x28);
      if (local_e0 == &local_d0) {
        *(ulong *)((long)local_a8._M_unused._0_8_ + 0x28) = CONCAT71(uStack_cf,local_d0);
        *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x30) = uStack_c8;
      }
      else {
        *(undefined1 **)((long)local_a8._M_unused._0_8_ + 0x18) = local_e0;
        *(ulong *)((long)local_a8._M_unused._0_8_ + 0x28) = CONCAT71(uStack_cf,local_d0);
      }
      *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x20) = local_d8;
      local_d8 = 0;
      local_d0 = 0;
      *(Poll **)((long)local_a8._M_unused._0_8_ + 0x38) = p;
      *(CLIListener **)((long)local_a8._M_unused._0_8_ + 0x40) = this;
      pcStack_90 = std::
                   _Function_handler<void_(dto::Complex_&,_sockaddr_in),_std::_Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short))(Poll_&,_dto::Complex_&,_sockaddr_in,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short)>_>
                   ::_M_invoke;
      local_98 = std::
                 _Function_handler<void_(dto::Complex_&,_sockaddr_in),_std::_Bind<void_(CLIListener::*(CLIListener_*,_std::reference_wrapper<Poll>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short))(Poll_&,_dto::Complex_&,_sockaddr_in,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short)>_>
                 ::_M_manager;
      local_e0 = &local_d0;
      MultiQuery<dto::Simple,_dto::Complex>::when_response(this_01,(OnResponse *)&local_a8);
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
      }
      local_50.super__Function_base._M_functor._8_8_ = 0;
      local_50.super__Function_base._M_functor._M_unused._M_object = request_failed;
      local_50._M_invoker = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
      local_50.super__Function_base._M_manager =
           std::_Function_handler<void_(),_void_(*)()>::_M_manager;
      MultiQuery<dto::Simple,_dto::Complex>::when_error(local_158,&local_50);
      if (local_50.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_50.super__Function_base._M_manager)
                  ((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
      }
      if (local_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,
                        CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not found file ",0xf);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(arg->_M_dataplus)._M_p,arg->_M_string_length);
    pcVar8 = " in search results";
    lVar7 = 0x12;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,lVar7);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return;
}

Assistant:

void CLIListener::do_fetch(Poll &p, std::string &arg) {
  if (file_server.find(arg) == file_server.end()) {
    std::cout << "Could not find a server to fetch from, execute search first" << std::endl;
    return;
  }
  if (file_server.find(arg) == file_server.end()) {
    std::cout << "Not found file " << arg << " in search results" << std::endl;
    return;
  }
  auto addr = file_server[arg];
  auto dto = dto::create(cmd_seq++, "GET", arg);
  auto query = std::make_shared<MultiQuery<dto::Simple, dto::Complex>>(dto, port, addr, LONG_TIMEOUT_MILLIS);
  p.subscribe(query);
  query->when_response(std::bind(&CLIListener::on_fetch_result, this, std::ref(p), _1, _2, addr, port));
  query->when_error(request_failed);
}